

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

string * __thiscall
cmCTestHG::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestHG *this)

{
  undefined1 local_1b8 [8];
  OutputLogger err;
  undefined1 local_168 [8];
  IdentifyParser out;
  char *local_48;
  char *hg_identify [4];
  char *hg;
  cmCTestHG *this_local;
  string *rev;
  
  local_48 = (char *)std::__cxx11::string::c_str();
  hg_identify[0] = "identify";
  hg_identify[1] = "-i";
  hg_identify[2] = (char *)0x0;
  out.RegexIdentify.searchstring._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  IdentifyParser::IdentifyParser
            ((IdentifyParser *)local_168,this,"rev-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_1b8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rev-err> "
            );
  cmCTestVC::RunChild((cmCTestVC *)this,&local_48,(OutputParser *)local_168,
                      (OutputParser *)local_1b8,(char *)0x0);
  out.RegexIdentify.searchstring._7_1_ = 1;
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_1b8);
  IdentifyParser::~IdentifyParser((IdentifyParser *)local_168);
  if ((out.RegexIdentify.searchstring._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestHG::GetWorkingRevision()
{
  // Run plumbing "hg identify" to get work tree revision.
  const char* hg = this->CommandLineTool.c_str();
  const char* hg_identify[] = {hg, "identify","-i", 0};
  std::string rev;
  IdentifyParser out(this, "rev-out> ", rev);
  OutputLogger err(this->Log, "rev-err> ");
  this->RunChild(hg_identify, &out, &err);
  return rev;
}